

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

uint __thiscall node::anon_unknown_2::ChainImpl::estimateMaxBlocks(ChainImpl *this)

{
  CBlockPolicyEstimator *this_00;
  uint uVar1;
  long in_FS_OFFSET;
  
  this_00 = (this->m_node->fee_estimator)._M_t.
            super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>
            ._M_t.
            super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>
            .super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl;
  if (this_00 == (CBlockPolicyEstimator *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      return 0;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    uVar1 = CBlockPolicyEstimator::HighestTargetTracked(this_00,LONG_HALFLIFE);
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int estimateMaxBlocks() override
    {
        if (!m_node.fee_estimator) return 0;
        return m_node.fee_estimator->HighestTargetTracked(FeeEstimateHorizon::LONG_HALFLIFE);
    }